

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool anon_unknown.dwarf_116af00::ExpandMacros<cmCMakePresetsGraph::BuildPreset>
               (cmCMakePresetsGraph *graph,BuildPreset *preset,
               optional<cmCMakePresetsGraph::BuildPreset> *out)

{
  _Base_ptr p_Var1;
  char cVar2;
  element_type *peVar3;
  byte bVar4;
  ExpandMacroResult EVar5;
  int iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  pointer pbVar9;
  byte bVar10;
  _Any_data *__x;
  pointer pbVar11;
  optional<bool> result;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  macroExpanders;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  _Any_data local_b8;
  undefined8 local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  local_60;
  
  std::optional<cmCMakePresetsGraph::BuildPreset>::emplace<cmCMakePresetsGraph::BuildPreset_const&>
            (out,preset);
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload._M_value.
           super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = (_Base_ptr)
           ((long)&(out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>).
                   _M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
                   super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload + 0xb0)
  ;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var8 != p_Var1) {
    do {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[](&local_60,(key_type *)(p_Var8 + 1));
      *pmVar7 = Unvisited;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var1);
  }
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = 0;
  local_68 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
             ::_M_manager;
  local_a0._8_8_ = 0;
  local_80._M_unused._M_object = graph;
  local_80._8_8_ = preset;
  local_a0._M_unused._M_object = operator_new(0x18);
  *(_Any_data **)local_a0._M_unused._0_8_ = &local_b8;
  *(optional<cmCMakePresetsGraph::BuildPreset> **)((long)local_a0._M_unused._0_8_ + 8) = out;
  *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    **)((long)local_a0._M_unused._0_8_ + 0x10) = &local_60;
  local_88 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
             ::_M_manager;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&local_b8,(value_type *)&local_80);
  __x = &local_a0;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&local_b8,(value_type *)__x);
  p_Var8 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload._M_value.
           super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var8 != p_Var1) {
    do {
      if ((char)p_Var8[3]._M_color == _S_black) {
        __x = (_Any_data *)(p_Var8 + 1);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[](&local_60,(key_type *)__x);
        if (*pmVar7 != Verified) {
          if (*pmVar7 == InProgress) goto LAB_00343e6a;
          iVar6 = ((preset->super_Preset).OriginFile)->Version;
          *pmVar7 = InProgress;
          __x = &local_b8;
          EVar5 = ExpandMacros((string *)(p_Var8 + 2),
                               (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                *)&local_b8,iVar6);
          if (EVar5 == Ok) {
            *pmVar7 = Verified;
          }
          else {
            if (EVar5 == Ignore) {
              bVar10 = 1;
              cVar2 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>).
                      _M_payload.
                      super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
                      super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_engaged;
              goto joined_r0x00343ea6;
            }
            if (EVar5 == Error) goto LAB_00343e6a;
          }
        }
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var1);
  }
  peVar3 = (preset->super_Preset).ConditionEvaluator.
           super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    pbVar11 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload
              .super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload._M_value.
              Targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload.
             super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
             super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload._M_value.
             Targets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar11 != pbVar9) {
      do {
        __x = &local_b8;
        EVar5 = ExpandMacros(pbVar11,(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                      *)&local_b8,((preset->super_Preset).OriginFile)->Version);
        if (EVar5 == Error) goto LAB_00343e6a;
        if (EVar5 == Ignore) {
          bVar10 = 1;
          bVar4 = 1;
          if ((out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload
              .super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_engaged != true)
          goto LAB_00343edd;
          goto LAB_00343ea8;
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar9);
    }
    pbVar11 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload
              .super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload._M_value.
              NativeToolOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload.
             super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
             super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_payload._M_value.
             NativeToolOptions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar10 = 1;
    if (pbVar11 != pbVar9) {
      do {
        __x = &local_b8;
        EVar5 = ExpandMacros(pbVar11,(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                      *)&local_b8,((preset->super_Preset).OriginFile)->Version);
        if (EVar5 == Error) {
          bVar10 = 0;
          break;
        }
        if (EVar5 == Ignore) {
          pbVar9 = (pointer)0x1;
          if ((out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload
              .super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_engaged == true) {
            (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_engaged = false;
            cmCMakePresetsGraph::BuildPreset::~BuildPreset((BuildPreset *)out);
          }
          bVar10 = 0;
          goto LAB_00343eda;
        }
        pbVar11 = pbVar11 + 1;
        bVar10 = 1;
      } while (pbVar11 != pbVar9);
      pbVar9 = (pointer)0x0;
    }
LAB_00343eda:
    bVar10 = bVar10 | (byte)pbVar9;
  }
  else {
    __x = &local_b8;
    iVar6 = (*peVar3->_vptr_Condition[2])
                      (peVar3,__x,(ulong)(uint)((preset->super_Preset).OriginFile)->Version);
    bVar10 = (byte)iVar6;
    if (bVar10 != 0) {
      cVar2 = (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload
              .super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_engaged;
joined_r0x00343ea6:
      bVar4 = bVar10;
      if (cVar2 == '\x01') {
LAB_00343ea8:
        bVar10 = bVar4;
        (out->super__Optional_base<cmCMakePresetsGraph::BuildPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::BuildPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::BuildPreset>._M_engaged = false;
        cmCMakePresetsGraph::BuildPreset::~BuildPreset((BuildPreset *)out);
      }
    }
  }
LAB_00343edd:
  if (local_90 != (code *)0x0) {
    __x = &local_a0;
    (*local_90)(__x,__x,3);
  }
  if (local_70 != (code *)0x0) {
    __x = &local_80;
    (*local_70)(__x,__x,3);
  }
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)&local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)__x);
  return (bool)(bVar10 & 1);
LAB_00343e6a:
  bVar10 = 0;
  goto LAB_00343edd;
}

Assistant:

bool ExpandMacros(const cmCMakePresetsGraph& graph, const T& preset,
                  cm::optional<T>& out)
{
  out.emplace(preset);

  std::map<std::string, CycleStatus> envCycles;
  for (auto const& v : out->Environment) {
    envCycles[v.first] = CycleStatus::Unvisited;
  }

  std::vector<MacroExpander> macroExpanders;

  MacroExpander defaultMacroExpander =
    [&graph, &preset](const std::string& macroNamespace,
                      const std::string& macroName, std::string& macroOut,
                      int version) -> ExpandMacroResult {
    if (macroNamespace.empty()) {
      if (macroName == "sourceDir") {
        macroOut += graph.SourceDir;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceParentDir") {
        macroOut += cmSystemTools::GetParentDirectory(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceDirName") {
        macroOut += cmSystemTools::GetFilenameName(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "presetName") {
        macroOut += preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!preset.Hidden) {
          macroOut += graph.GetGeneratorForPreset(preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "dollar") {
        macroOut += '$';
        return ExpandMacroResult::Ok;
      }
      if (macroName == "hostSystemName") {
        if (version < 3) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemName();
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "pathListSep") {
        if (version < 5) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemPathlistSeparator();
        return ExpandMacroResult::Ok;
      }
    }

    return ExpandMacroResult::Ignore;
  };

  MacroExpander environmentMacroExpander =
    [&macroExpanders, &out, &envCycles](
      const std::string& macroNamespace, const std::string& macroName,
      std::string& result, int version) -> ExpandMacroResult {
    if (macroNamespace == "env" && !macroName.empty() && out) {
      auto v = out->Environment.find(macroName);
      if (v != out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, envCycles[macroName], macroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        result += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      const char* value = std::getenv(macroName.c_str());
      if (value) {
        result += value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  };

  macroExpanders.push_back(defaultMacroExpander);
  macroExpanders.push_back(environmentMacroExpander);

  for (auto& v : out->Environment) {
    if (v.second) {
      switch (VisitEnv(*v.second, envCycles[v.first], macroExpanders,
                       graph.GetVersion(preset))) {
        case ExpandMacroResult::Error:
          return false;
        case ExpandMacroResult::Ignore:
          out.reset();
          return true;
        case ExpandMacroResult::Ok:
          break;
      }
    }
  }

  if (preset.ConditionEvaluator) {
    cm::optional<bool> result;
    if (!preset.ConditionEvaluator->Evaluate(
          macroExpanders, graph.GetVersion(preset), result)) {
      return false;
    }
    if (!result) {
      out.reset();
      return true;
    }
    out->ConditionResult = *result;
  }

  return ExpandMacros(graph, preset, out, macroExpanders);
}